

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_slider_float(nk_context *ctx,float min_value,float *value,float max_value,float value_step)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  float fVar4;
  bool local_79;
  nk_context *local_78;
  undefined1 auStack_68 [4];
  nk_widget_layout_states state;
  nk_rect bounds;
  float old_value;
  int ret;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  float value_step_local;
  float max_value_local;
  float *value_local;
  float min_value_local;
  nk_context *ctx_local;
  
  bounds.h = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x51f3,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x51f4,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x51f5,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if (value == (float *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x51f6,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
      (ctx->current->layout == (nk_panel *)0x0)) || (value == (float *)0x0)) {
    ctx_local._4_4_ = 0.0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    nVar3 = nk_widget((nk_rect *)auStack_68,ctx);
    if (nVar3 == NK_WIDGET_INVALID) {
      ctx_local._4_4_ = bounds.h;
    }
    else {
      local_78 = ctx;
      if ((pnVar2->flags & 0x1000) != 0) {
        local_78 = (nk_context *)0x0;
      }
      bounds.w = *value;
      fVar4 = nk_do_slider(&ctx->last_widget_state,&pnVar1->buffer,_auStack_68,min_value,bounds.w,
                           max_value,value_step,&(ctx->style).slider,&local_78->input,
                           (ctx->style).font);
      *value = fVar4;
      local_79 = true;
      if (bounds.w < *value || bounds.w == *value) {
        local_79 = bounds.w < *value;
      }
      ctx_local._4_4_ = (float)(uint)local_79;
    }
  }
  return (int)ctx_local._4_4_;
}

Assistant:

NK_API int
nk_slider_float(struct nk_context *ctx, float min_value, float *value, float max_value,
    float value_step)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    int ret = 0;
    float old_value;
    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    NK_ASSERT(value);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return ret;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return ret;
    in = (/*state == NK_WIDGET_ROM || */ layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    old_value = *value;
    *value = nk_do_slider(&ctx->last_widget_state, &win->buffer, bounds, min_value,
                old_value, max_value, value_step, &style->slider, in, style->font);
    return (old_value > *value || old_value < *value);
}